

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O2

void __thiscall SemanticTypes::visit(SemanticTypes *this,AdditionOPNode *additionOpNode)

{
  ExpNode *pEVar1;
  bool bVar2;
  ulong uVar3;
  char *__format;
  
  pEVar1 = additionOpNode->exp1;
  if (pEVar1 == (ExpNode *)0x0) {
    uVar3 = (ulong)(uint)(additionOpNode->super_ExpNode).super_StmtNode.super_ASTNode.line;
    __format = "[SEMANTIC ERROR - additionOpNode] NO EXPRESSION TO BE ASSIGNED, line: %d\n";
  }
  else {
    (*(pEVar1->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar1,this);
    pEVar1 = additionOpNode->exp2;
    if (pEVar1 == (ExpNode *)0x0) {
      uVar3 = (ulong)(uint)(additionOpNode->super_ExpNode).super_StmtNode.super_ASTNode.line;
      __format = "[SEMANTIC ERROR - additionOpNode] NO EXPRESSION TO ASSIGN, line: %d\n";
    }
    else {
      (*(pEVar1->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar1,this);
      pEVar1 = additionOpNode->exp1;
      bVar2 = _match_exp_types(pEVar1,additionOpNode->exp2);
      if (bVar2) {
        if (pEVar1->type - 0xbU < 2) {
          (additionOpNode->super_ExpNode).type = pEVar1->type;
          (additionOpNode->super_ExpNode).typeLexeme = pEVar1->typeLexeme;
          (additionOpNode->super_ExpNode).pointer = pEVar1->pointer;
          (additionOpNode->super_ExpNode).arraySize = pEVar1->arraySize;
          (additionOpNode->super_ExpNode).lValue = false;
          return;
        }
        uVar3 = (ulong)(uint)(additionOpNode->super_ExpNode).super_StmtNode.super_ASTNode.line;
        __format = 
        "[SEMANTIC ERROR - additionOpNode] CANNOT OPERATE WITH NON NUMERIC VALUES, line: %d\n";
      }
      else {
        uVar3 = (ulong)(uint)(additionOpNode->super_ExpNode).super_StmtNode.super_ASTNode.line;
        __format = 
        "[SEMANTIC ERROR - additionOpNode] CANNOT ASSIGN AN EXPRESSION TO A DIFFERENT TYPE, line: %d\n"
        ;
      }
    }
  }
  fprintf(_stderr,__format,uVar3);
  return;
}

Assistant:

void SemanticTypes::visit(AdditionOPNode *additionOpNode) {

    if (additionOpNode->getExp1())
        additionOpNode->getExp1()->accept(this);
    else {
        fprintf(stderr,
                "[SEMANTIC ERROR - additionOpNode] NO EXPRESSION TO BE ASSIGNED, line: %d\n",
                additionOpNode->getLine());
        return;
    }

    if (additionOpNode->getExp2())
        additionOpNode->getExp2()->accept(this);
    else {
        fprintf(stderr,
                "[SEMANTIC ERROR - additionOpNode] NO EXPRESSION TO ASSIGN, line: %d\n",
                additionOpNode->getLine());
        return;
    }


    if (!_match_exp_types(additionOpNode->getExp1(), additionOpNode->getExp2())) {
        fprintf(stderr,
                "[SEMANTIC ERROR - additionOpNode] CANNOT ASSIGN AN EXPRESSION TO A DIFFERENT TYPE, line: %d\n",
                additionOpNode->getLine());
        return;
    }

    if (additionOpNode->getExp1()->getType() != INT && additionOpNode->getExp1()->getType() != FLOAT) {
        fprintf(stderr,
                "[SEMANTIC ERROR - additionOpNode] CANNOT OPERATE WITH NON NUMERIC VALUES, line: %d\n",
                additionOpNode->getLine());
        return;
    }

    additionOpNode->setType(additionOpNode->getExp1()->getType());
    additionOpNode->setTypeLexeme(additionOpNode->getExp1()->getTypeLexeme());
    additionOpNode->setPointer(additionOpNode->getExp1()->isPointer());
    additionOpNode->setArraySize(additionOpNode->getExp1()->getArraySize());
    additionOpNode->setLValue(false);
}